

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::VertexData::~VertexData(VertexData *this)

{
  pointer pVVar1;
  pointer pVVar2;
  
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
  ::clear(&(this->vertexBindings)._M_t);
  pVVar1 = (this->vertexElements).
           super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertexElements).
      super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->vertexElements).
    super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
  ::~_Rb_tree(&(this->vertexBindings)._M_t);
  pVVar1 = (this->vertexElements).
           super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->vertexElements).
                                 super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>_>_>
  ::~_Rb_tree(&(this->super_IVertexData).boneAssignmentsMap._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->super_IVertexData).vertexIndexMapping._M_t);
  pVVar2 = (this->super_IVertexData).boneAssignments.
           super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)(this->super_IVertexData).boneAssignments.
                                 super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2);
    return;
  }
  return;
}

Assistant:

VertexData::~VertexData()
{
    Reset();
}